

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O2

int xar_close(archive_write *a)

{
  void *buff;
  char cVar1;
  void *pvVar2;
  archive_rb_node *paVar3;
  void *pvVar4;
  heap_data *heap;
  xmlChar *pxVar5;
  bool bVar6;
  xmlTextWriterPtr pxVar7;
  uint uVar8;
  int iVar9;
  mode_t mVar10;
  uint uVar11;
  wchar_t wVar12;
  int iVar13;
  archive_rb_node *self;
  xml_writer *ctx;
  xmlBufferPtr pxVar14;
  time_t t;
  long lVar15;
  la_int64_t lVar16;
  dev_t dVar17;
  int *piVar18;
  archive_string_conv *fflags_text;
  ulong uVar19;
  char *pcVar20;
  char *format;
  char *format_00;
  ulong __n;
  long lVar21;
  char *pcVar22;
  uint64_t offset;
  archive_rb_node *paVar23;
  int iVar24;
  heap_data **pphVar25;
  size_t size;
  char *name;
  chksumwork_conflict *local_98;
  void *local_90;
  xmlTextWriterPtr local_88;
  size_t len;
  char *p;
  la_zstream *local_70;
  archive_string local_68;
  uint64_t local_48;
  size_t local_40;
  void *value;
  
  pvVar2 = a->format_data;
  if (*(long *)(*(long *)((long)pvVar2 + 0x18) + 0x60) == 0) {
    return 0;
  }
  local_48 = *(uint64_t *)((long)pvVar2 + 8);
  for (self = __archive_rb_tree_iterate
                        ((archive_rb_tree *)((long)pvVar2 + 0x101b8),(archive_rb_node *)0x0,0);
      self != (archive_rb_node *)0x0;
      self = __archive_rb_tree_iterate((archive_rb_tree *)((long)pvVar2 + 0x101b8),self,1)) {
    paVar3 = self[1].rb_nodes[1];
    archive_entry_set_nlink((archive_entry *)paVar3[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    paVar23 = paVar3;
    if (1 < *(int *)self[1].rb_nodes) {
      paVar3[3].rb_nodes[1] = paVar3;
    }
    while (paVar23 = paVar23[3].rb_nodes[0], paVar23 != (archive_rb_node *)0x0) {
      paVar23[3].rb_nodes[1] = paVar3;
      archive_entry_set_nlink((archive_entry *)paVar23[1].rb_nodes[1],*(uint *)self[1].rb_nodes);
    }
  }
  pvVar4 = a->format_data;
  ctx = (xml_writer *)calloc(1,0x18);
  if (ctx == (xml_writer *)0x0) goto LAB_001586e7;
  pxVar14 = (xmlBufferPtr)xmlBufferCreate();
  ctx->bp = pxVar14;
  if (pxVar14 != (xmlBufferPtr)0x0) {
    local_88 = (xmlTextWriterPtr)xmlNewTextWriterMemory(pxVar14,0);
    ctx->writer = local_88;
    if (local_88 != (xmlTextWriterPtr)0x0) {
      iVar13 = -0x1e;
      ctx->indent = 4;
      uVar8 = xmlTextWriterStartDocument(local_88,"1.0","UTF-8",0);
      if (((int)uVar8 < 0) || (uVar8 = xmlTextWriterSetIndent(local_88,4), (int)uVar8 < 0)) {
        pcVar20 = "xml_writer_start_document() failed: %d";
      }
      else {
        uVar8 = xml_writer_start_element(ctx,"xar");
        if ((int)uVar8 < 0) {
          pcVar20 = "xml_writer_start_element() failed: %d";
        }
        else {
          uVar8 = xml_writer_start_element(ctx,"toc");
          if ((int)uVar8 < 0) {
LAB_00158729:
            pcVar20 = "xml_writer_start_element() failed: %d";
          }
          else {
            bVar6 = false;
            iVar24 = 0;
            t = time((time_t *)0x0);
            iVar9 = xmlwrite_time(a,ctx,"creation-time",t,0);
            if (iVar9 < 0) goto LAB_001585d1;
            pcVar20 = (char *)0x14;
            if (*(int *)((long)pvVar4 + 0x80) == 1) {
              iVar24 = 0x14;
            }
            iVar9 = 0x10;
            if (*(int *)((long)pvVar4 + 0x80) != 2) {
              iVar9 = iVar24;
            }
            if (iVar9 == 0) {
LAB_00157c7c:
              lVar21 = *(long *)((long)pvVar4 + 0x18);
              lVar15 = *(long *)(lVar21 + 0x58);
              do {
                pxVar7 = local_88;
                if (lVar21 != lVar15) {
                  local_90 = a->format_data;
                  pcVar20 = *(char **)(lVar21 + 0x88);
                  do {
                    cVar1 = *pcVar20;
                    if (cVar1 == '\0') {
                      iVar9 = xmlwrite_string(a,ctx,"name",*(char **)(lVar21 + 0x88));
                      if (-1 < iVar9) goto LAB_00157d74;
                      goto LAB_00158795;
                    }
                    pcVar20 = pcVar20 + 1;
                  } while (-1 < cVar1);
                  uVar8 = xml_writer_start_element(ctx,"name");
                  if ((int)uVar8 < 0) {
                    pcVar20 = "xml_writer_start_element() failed: %d";
                  }
                  else {
                    uVar8 = xml_writer_write_attribute(ctx,"enctype","base64");
                    if ((int)uVar8 < 0) {
                      pcVar20 = "xml_writer_write_attribute() failed: %d";
                    }
                    else {
                      uVar8 = xmlTextWriterWriteBase64
                                        (pxVar7,*(undefined8 *)(lVar21 + 0x88),0,
                                         *(undefined4 *)(lVar21 + 0x90));
                      if ((int)uVar8 < 0) {
                        pcVar20 = "xml_writer_write_base64() failed: %d";
                      }
                      else {
                        uVar8 = xml_writer_end_element(ctx);
                        if ((int)uVar8 < 0) {
LAB_0015876c:
                          pcVar20 = "xml_writer_end_element() failed: %d";
                        }
                        else {
LAB_00157d74:
                          local_68.s = (char *)0x0;
                          local_68.length = 0;
                          local_68.buffer_length = 0;
                          mVar10 = archive_entry_filetype(*(archive_entry **)(lVar21 + 0x20));
                          uVar8 = mVar10 - 0x1000 >> 0xc;
                          uVar11 = mVar10 << 0x14 | uVar8;
                          if ((uVar11 < 0xc) && ((0xa2bU >> (uVar8 & 0x1f) & 1) != 0)) {
                            pcVar20 = &DAT_0017f3cc + *(int *)(&DAT_0017f3cc + (ulong)uVar11 * 4);
LAB_00157df2:
                            pcVar22 = (char *)0x0;
                          }
                          else {
                            lVar15 = *(long *)(lVar21 + 0x50);
                            if (lVar15 == 0) {
                              pcVar20 = "file";
                              goto LAB_00157df2;
                            }
                            if (lVar15 == lVar21) {
                              local_68.length = 0;
                              archive_strncat(&local_68,"original",8);
                            }
                            else {
                              archive_string_sprintf(&local_68,"%d",(ulong)*(uint *)(lVar15 + 0x18))
                              ;
                            }
                            pcVar20 = "hardlink";
                            pcVar22 = "link";
                          }
                          iVar9 = xmlwrite_string_attr(a,ctx,"type",pcVar20,pcVar22,local_68.s);
                          archive_string_free(&local_68);
                          if (iVar9 < 0) goto LAB_00158795;
                          if ((*(byte *)(lVar21 + 0x168) & 1) != 0) goto LAB_001583ed;
                          mVar10 = archive_entry_filetype(*(archive_entry **)(lVar21 + 0x20));
                          if ((mVar10 != 0x2000) && (mVar10 != 0x6000)) {
                            if ((mVar10 != 0xa000) ||
                               (iVar9 = xmlwrite_string_attr
                                                  (a,ctx,"link",*(char **)(lVar21 + 0xa0),"type",
                                                   "broken"), -1 < iVar9)) {
LAB_00157f3f:
                              lVar16 = archive_entry_ino64(*(archive_entry **)(lVar21 + 0x20));
                              iVar9 = xmlwrite_fstring(a,ctx,"inode","%jd",lVar16);
                              if (-1 < iVar9) {
                                dVar17 = archive_entry_dev(*(archive_entry **)(lVar21 + 0x20));
                                if (dVar17 != 0) {
                                  dVar17 = archive_entry_dev(*(archive_entry **)(lVar21 + 0x20));
                                  iVar9 = xmlwrite_fstring(a,ctx,"deviceno","%d",dVar17);
                                  if (iVar9 < 0) goto LAB_00158795;
                                }
                                mVar10 = archive_entry_mode(*(archive_entry **)(lVar21 + 0x20));
                                name._0_1_ = 0x30;
                                name._1_1_ = (byte)(mVar10 >> 6) & 7 | 0x30;
                                name._2_1_ = (byte)mVar10 >> 3 & 7 | 0x30;
                                name._3_1_ = (byte)mVar10 & 7 | 0x30;
                                name._4_4_ = name._4_4_ & 0xffffff00;
                                iVar9 = xmlwrite_string(a,ctx,"mode",(char *)&name);
                                if (-1 < iVar9) {
                                  lVar16 = archive_entry_uid(*(archive_entry **)(lVar21 + 0x20));
                                  iVar9 = xmlwrite_fstring(a,ctx,"uid","%d",lVar16);
                                  if (-1 < iVar9) {
                                    wVar12 = _archive_entry_uname_l
                                                       (*(archive_entry **)(lVar21 + 0x20),&p,&len,
                                                        *(archive_string_conv **)
                                                         ((long)local_90 + 0x118));
                                    if (wVar12 == L'\0') {
                                      local_98 = (chksumwork_conflict *)
                                                 ((ulong)local_98 & 0xffffffff00000000);
LAB_00158099:
                                      if ((len == 0) ||
                                         (iVar9 = xmlwrite_string(a,ctx,"user",p), -1 < iVar9)) {
                                        archive_entry_gid(*(archive_entry **)(lVar21 + 0x20));
                                        iVar9 = xmlwrite_fstring(a,ctx,"gid","%d");
                                        if (-1 < iVar9) {
                                          pcVar20 = *(char **)((long)local_90 + 0x118);
                                          wVar12 = _archive_entry_gname_l
                                                             (*(archive_entry **)(lVar21 + 0x20),&p,
                                                              &len,(archive_string_conv *)pcVar20);
                                          if (wVar12 != L'\0') {
                                            piVar18 = __errno_location();
                                            if (*piVar18 == 0xc) {
                                              pcVar20 = "Can\'t allocate memory for Gname";
                                              goto LAB_001587e6;
                                            }
                                            pcVar20 = archive_entry_gname(*(archive_entry **)
                                                                           (lVar21 + 0x20));
                                            archive_set_error(&a->archive,0x54,
                                                                                                                            
                                                  "Can\'t translate gname \'%s\' to UTF-8");
                                            local_98 = (chksumwork_conflict *)
                                                       CONCAT44(local_98._4_4_,0xffffffec);
                                          }
                                          if ((len == 0) ||
                                             (pcVar20 = p, iVar9 = xmlwrite_string(a,ctx,"group",p),
                                             -1 < iVar9)) {
                                            wVar12 = archive_entry_ctime_is_set
                                                               (*(archive_entry **)(lVar21 + 0x20));
                                            if (wVar12 != L'\0') {
                                              pcVar20 = (char *)archive_entry_ctime(*(archive_entry
                                                                                      **)(lVar21 + 
                                                  0x20));
                                              iVar9 = xmlwrite_time(a,ctx,"ctime",(time_t)pcVar20,1)
                                              ;
                                              if (iVar9 < 0) goto LAB_00158795;
                                            }
                                            wVar12 = archive_entry_mtime_is_set
                                                               (*(archive_entry **)(lVar21 + 0x20));
                                            if (wVar12 != L'\0') {
                                              pcVar20 = (char *)archive_entry_mtime(*(archive_entry
                                                                                      **)(lVar21 + 
                                                  0x20));
                                              iVar9 = xmlwrite_time(a,ctx,"mtime",(time_t)pcVar20,1)
                                              ;
                                              if (iVar9 < 0) goto LAB_00158795;
                                            }
                                            wVar12 = archive_entry_atime_is_set
                                                               (*(archive_entry **)(lVar21 + 0x20));
                                            if (wVar12 != L'\0') {
                                              pcVar20 = (char *)archive_entry_atime(*(archive_entry
                                                                                      **)(lVar21 + 
                                                  0x20));
                                              iVar9 = xmlwrite_time(a,ctx,"atime",(time_t)pcVar20,1)
                                              ;
                                              if (iVar9 < 0) goto LAB_00158795;
                                            }
                                            fflags_text = (archive_string_conv *)
                                                          archive_entry_fflags_text
                                                                    (*(archive_entry **)
                                                                      (lVar21 + 0x20));
                                            if ((fflags_text == (archive_string_conv *)0x0) ||
                                               ((iVar9 = make_fflags_entry(a,ctx,"flags",
                                                                           (char *)fflags_text),
                                                -1 < iVar9 &&
                                                (iVar9 = make_fflags_entry(a,ctx,"ext2",
                                                                           (char *)fflags_text),
                                                pcVar20 = (char *)fflags_text, -1 < iVar9)))) {
                                              archive_entry_xattr_reset
                                                        (*(archive_entry **)(lVar21 + 0x20));
                                              pphVar25 = (heap_data **)(lVar21 + 0xc0);
                                              while (heap = *pphVar25, heap != (heap_data *)0x0) {
                                                archive_entry_xattr_next
                                                          (*(archive_entry **)(lVar21 + 0x20),&name,
                                                           &value,&local_40);
                                                pcVar20 = "ea";
                                                uVar8 = xml_writer_start_element(ctx,"ea");
                                                if ((int)uVar8 < 0) goto LAB_00158775;
                                                uVar8 = xml_writer_write_attributef
                                                                  (ctx,pcVar20,format,
                                                                   (ulong)(uint)heap->id);
                                                if ((int)uVar8 < 0) {
                                                  pcVar20 = 
                                                  "xml_writer_write_attributef() failed: %d";
                                                  goto LAB_0015878c;
                                                }
                                                iVar9 = xmlwrite_heap(a,ctx,heap);
                                                if (iVar9 < 0) goto LAB_00158795;
                                                pcVar20 = (char *)CONCAT44(name._4_4_,
                                                                           CONCAT13(name._3_1_,
                                                                                    CONCAT12(name.
                                                  _2_1_,CONCAT11(name._1_1_,name._0_1_))));
                                                iVar9 = xmlwrite_string(a,ctx,"name",pcVar20);
                                                if (iVar9 < 0) goto LAB_00158795;
                                                uVar8 = xml_writer_end_element(ctx);
                                                if ((int)uVar8 < 0) goto LAB_0015876c;
                                                pphVar25 = &heap->next;
                                              }
                                              if (*(long *)(lVar21 + 0xe8) != 0) {
                                                uVar8 = xml_writer_start_element(ctx,"data");
                                                if ((int)uVar8 < 0) {
                                                  pcVar20 = "xml_writer_start_element() failed: %d";
                                                  goto LAB_0015878c;
                                                }
                                                iVar9 = xmlwrite_heap(a,ctx,(heap_data *)
                                                                            (lVar21 + 0xd0));
                                                if (iVar9 < 0) goto LAB_00158795;
                                                uVar8 = xml_writer_end_element(ctx);
                                                if ((int)uVar8 < 0) goto LAB_0015876c;
                                              }
                                              if (*(long *)(lVar21 + 0x158) != 0) {
                                                uVar8 = xml_writer_start_element(ctx,"content");
                                                if ((int)uVar8 < 0) goto LAB_00158775;
                                                iVar9 = xmlwrite_string(a,ctx,"interpreter",
                                                                        *(char **)(lVar21 + 0x150));
                                                if (iVar9 < 0) goto LAB_00158795;
                                                pcVar20 = "script";
                                                iVar9 = xmlwrite_string(a,ctx,"type","script");
                                                if (iVar9 < 0) goto LAB_00158795;
                                                uVar8 = xml_writer_end_element(ctx);
                                                if ((int)uVar8 < 0) goto LAB_0015876c;
                                              }
                                              if ((int)local_98 == 0) goto LAB_001583ed;
                                            }
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      piVar18 = __errno_location();
                                      if (*piVar18 != 0xc) {
                                        pcVar20 = archive_entry_uname(*(archive_entry **)
                                                                       (lVar21 + 0x20));
                                        archive_set_error(&a->archive,0x54,
                                                          "Can\'t translate uname \'%s\' to UTF-8",
                                                          pcVar20);
                                        local_98 = (chksumwork_conflict *)
                                                   CONCAT44(local_98._4_4_,0xffffffec);
                                        goto LAB_00158099;
                                      }
                                      pcVar20 = "Can\'t allocate memory for Uname";
LAB_001587e6:
                                      archive_set_error(&a->archive,0xc,pcVar20);
                                    }
                                  }
                                }
                              }
                            }
                            goto LAB_00158795;
                          }
                          uVar8 = xml_writer_start_element(ctx,"device");
                          if (-1 < (int)uVar8) {
                            dVar17 = archive_entry_rdevmajor(*(archive_entry **)(lVar21 + 0x20));
                            iVar9 = xmlwrite_fstring(a,ctx,"major","%d",dVar17);
                            if (-1 < iVar9) {
                              dVar17 = archive_entry_rdevminor(*(archive_entry **)(lVar21 + 0x20));
                              iVar9 = xmlwrite_fstring(a,ctx,"minor","%d",dVar17);
                              if (-1 < iVar9) {
                                uVar8 = xml_writer_end_element(ctx);
                                if ((int)uVar8 < 0) goto LAB_0015876c;
                                goto LAB_00157f3f;
                              }
                            }
                            goto LAB_00158795;
                          }
LAB_00158775:
                          pcVar20 = "xml_writer_start_element() failed: %d";
                        }
                      }
                    }
                  }
LAB_0015878c:
                  archive_set_error(&a->archive,-1,pcVar20,(ulong)uVar8);
                  goto LAB_00158795;
                }
LAB_001583ed:
                if (((*(byte *)(lVar21 + 0x168) & 2) == 0) ||
                   (lVar15 = *(long *)(lVar21 + 0x60), lVar15 == 0)) {
                  for (; lVar21 != *(long *)(lVar21 + 0x58); lVar21 = *(long *)(lVar21 + 0x58)) {
                    uVar8 = xml_writer_end_element(ctx);
                    if ((int)uVar8 < 0) goto LAB_00158754;
                    lVar15 = *(long *)(lVar21 + 0x40);
                    if (lVar15 != 0) goto LAB_001583ff;
                  }
                }
                else {
LAB_001583ff:
                  pcVar22 = "file";
                  uVar8 = xml_writer_start_element(ctx,"file");
                  if ((int)uVar8 < 0) goto LAB_00158729;
                  pcVar20 = (char *)(ulong)*(uint *)(lVar15 + 0x18);
                  uVar8 = xml_writer_write_attributef(ctx,pcVar22,format_00);
                  lVar21 = lVar15;
                  if ((int)uVar8 < 0) {
                    pcVar20 = "xml_writer_write_attributef() failed: %d";
                    goto LAB_001585c8;
                  }
                }
                iVar9 = (int)pcVar20;
                lVar15 = *(long *)(lVar21 + 0x58);
              } while (lVar21 != lVar15);
              uVar8 = xmlTextWriterEndDocument(local_88);
              if (-1 < (int)uVar8) {
                pxVar5 = pxVar14->content;
                uVar8 = pxVar14->use;
                *(undefined8 *)((long)pvVar4 + 0x10138) = *(undefined8 *)((long)pvVar4 + 8);
                *(ulong *)((long)pvVar4 + 0x10148) = (ulong)uVar8;
                local_98 = (chksumwork_conflict *)((long)pvVar4 + 0x98);
                checksum_init(local_98,*(sumalg *)((long)pvVar4 + 0x80));
                local_70 = (la_zstream *)((long)pvVar4 + 200);
                iVar9 = compression_init_encoder_gzip(&a->archive,local_70,6,iVar9);
                if (iVar9 == 0) {
                  *(xmlChar **)((long)pvVar4 + 200) = pxVar5;
                  *(ulong *)((long)pvVar4 + 0xd0) = (ulong)uVar8;
                  *(undefined8 *)((long)pvVar4 + 0xd8) = 0;
                  buff = (void *)((long)pvVar4 + 0x120);
                  *(void **)((long)pvVar4 + 0xe0) = buff;
                  *(undefined8 *)((long)pvVar4 + 0xe8) = 0x10000;
                  *(undefined8 *)((long)pvVar4 + 0xf0) = 0;
                  while( true ) {
                    if (*(int *)((long)pvVar4 + 0xf8) == 0) {
                      local_90 = (void *)CONCAT71(local_90._1_7_,1);
                      size = 0;
                    }
                    else {
                      bVar6 = false;
                      uVar8 = (**(code **)((long)pvVar4 + 0x108))(a,local_70,0);
                      if (1 < uVar8) goto LAB_001585d1;
                      size = 0x10000 - *(long *)((long)pvVar4 + 0xe8);
                      local_90 = (void *)CONCAT71(local_90._1_7_,uVar8 == 0);
                    }
                    checksum_update(local_98,buff,size);
                    iVar9 = write_to_temp(a,buff,size);
                    if (iVar9 != 0) goto LAB_00158795;
                    if ((char)local_90 == '\0') break;
                    *(void **)((long)pvVar4 + 0xe0) = buff;
                    *(undefined8 *)((long)pvVar4 + 0xe8) = 0x10000;
                  }
                  if ((*(int *)((long)pvVar4 + 0xf8) == 0) ||
                     (iVar9 = (**(code **)((long)pvVar4 + 0x110))(a,local_70), iVar9 == 0)) {
                    *(undefined8 *)((long)pvVar4 + 0x10140) = *(undefined8 *)((long)pvVar4 + 0xf0);
                    *(undefined4 *)((long)pvVar4 + 0x10150) = 1;
                    checksum_final(local_98,(chksumval_conflict *)((long)pvVar4 + 0x10158));
                    iVar13 = 0;
                    bVar6 = true;
                    goto LAB_001585d1;
                  }
                }
LAB_00158795:
                bVar6 = false;
                goto LAB_001585d1;
              }
              pcVar20 = "xml_writer_end_document() failed: %d";
            }
            else {
              uVar8 = xml_writer_start_element(ctx,"checksum");
              if ((int)uVar8 < 0) goto LAB_00158729;
              pcVar20 = (char *)0x0;
              if (*(int *)((long)pvVar4 + 0x80) == 1) {
                pcVar20 = "sha1";
              }
              pcVar22 = "md5";
              if (*(int *)((long)pvVar4 + 0x80) != 2) {
                pcVar22 = pcVar20;
              }
              uVar8 = xml_writer_write_attribute(ctx,"style",pcVar22);
              if ((int)uVar8 < 0) {
                pcVar20 = "xml_writer_write_attribute() failed: %d";
              }
              else {
                iVar9 = xmlwrite_string(a,ctx,"offset","0");
                if (iVar9 < 0) goto LAB_00158795;
                pcVar20 = "%d";
                bVar6 = false;
                iVar9 = xmlwrite_fstring(a,ctx,"size","%d");
                if (iVar9 < 0) goto LAB_001585d1;
                uVar8 = xml_writer_end_element(ctx);
                if (-1 < (int)uVar8) goto LAB_00157c7c;
LAB_00158754:
                pcVar20 = "xml_writer_end_element() failed: %d";
              }
            }
          }
        }
      }
LAB_001585c8:
      bVar6 = false;
      archive_set_error(&a->archive,-1,pcVar20,(ulong)uVar8);
LAB_001585d1:
      xmlFreeTextWriter(local_88);
      xmlBufferFree(pxVar14);
      free(ctx);
      if (!bVar6) {
        return iVar13;
      }
      *(undefined8 *)((long)pvVar2 + 0x10120) = 0x10000;
      *(undefined8 *)((long)pvVar2 + 0x120) = 0x1001c0021726178;
      archive_be64enc((void *)((long)pvVar2 + 0x128),*(uint64_t *)((long)pvVar2 + 0x10140));
      archive_be64enc((void *)((long)pvVar2 + 0x130),*(uint64_t *)((long)pvVar2 + 0x10148));
      uVar8 = *(uint *)((long)pvVar2 + 0x10158);
      *(uint *)((long)pvVar2 + 0x138) =
           uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 | uVar8 << 0x18;
      *(long *)((long)pvVar2 + 0x10120) = *(long *)((long)pvVar2 + 0x10120) + -0x1c;
      iVar13 = copy_out(a,*(uint64_t *)((long)pvVar2 + 0x10138),
                        *(uint64_t *)((long)pvVar2 + 0x10140));
      if (iVar13 != 0) {
        return iVar13;
      }
      __n = *(ulong *)((long)pvVar2 + 0x10160);
      if (__n == 0) {
        offset = 0;
      }
      else {
        uVar19 = *(ulong *)((long)pvVar2 + 0x10120);
        if (uVar19 < __n) {
          iVar13 = flush_wbuff(a);
          if (iVar13 != 0) {
            return iVar13;
          }
          uVar19 = *(ulong *)((long)pvVar2 + 0x10120);
          __n = *(size_t *)((long)pvVar2 + 0x10160);
        }
        memcpy((void *)((long)pvVar2 + (0x10120 - uVar19)),(void *)((long)pvVar2 + 0x10168),__n);
        offset = *(uint64_t *)((long)pvVar2 + 0x10160);
        *(long *)((long)pvVar2 + 0x10120) = *(long *)((long)pvVar2 + 0x10120) - offset;
      }
      iVar13 = copy_out(a,offset,local_48);
      if (iVar13 != 0) {
        return iVar13;
      }
      iVar13 = flush_wbuff(a);
      return iVar13;
    }
    xmlBufferFree(pxVar14);
  }
  free(ctx);
LAB_001586e7:
  archive_set_error(&a->archive,-1,"xml_writer_create() failed: %d");
  return -0x1e;
}

Assistant:

static int
xar_close(struct archive_write *a)
{
	struct xar *xar;
	unsigned char *wb;
	uint64_t length;
	int r;

	xar = (struct xar *)a->format_data;

	/* Empty! */
	if (xar->root->children.first == NULL)
		return (ARCHIVE_OK);

	/* Save the length of all file extended attributes and contents. */
	length = xar->temp_offset;

	/* Connect hardlinked files */
	file_connect_hardlink_files(xar);

	/* Make the TOC */
	r = make_toc(a);
	if (r != ARCHIVE_OK)
		return (r);
	/*
	 * Make the xar header on wbuff(write buffer).
	 */
	wb = xar->wbuff;
	xar->wbuff_remaining = sizeof(xar->wbuff);
	archive_be32enc(&wb[0], HEADER_MAGIC);
	archive_be16enc(&wb[4], HEADER_SIZE);
	archive_be16enc(&wb[6], HEADER_VERSION);
	archive_be64enc(&wb[8], xar->toc.length);
	archive_be64enc(&wb[16], xar->toc.size);
	archive_be32enc(&wb[24], xar->toc.a_sum.alg);
	xar->wbuff_remaining -= HEADER_SIZE;

	/*
	 * Write the TOC
	 */
	r = copy_out(a, xar->toc.temp_offset, xar->toc.length);
	if (r != ARCHIVE_OK)
		return (r);

	/* Write the checksum value of the TOC. */
	if (xar->toc.a_sum.len) {
		if (xar->wbuff_remaining < xar->toc.a_sum.len) {
			r = flush_wbuff(a);
			if (r != ARCHIVE_OK)
				return (r);
		}
		wb = xar->wbuff + (sizeof(xar->wbuff) - xar->wbuff_remaining);
		memcpy(wb, xar->toc.a_sum.val, xar->toc.a_sum.len);
		xar->wbuff_remaining -= xar->toc.a_sum.len;
	}

	/*
	 * Write all file extended attributes and contents.
	 */
	r = copy_out(a, xar->toc.a_sum.len, length);
	if (r != ARCHIVE_OK)
		return (r);
	r = flush_wbuff(a);
	return (r);
}